

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::writePlotFileDoit(Amr *this,string *pltfile,bool regular)

{
  ostringstream *this_00;
  ostringstream *this_01;
  pointer pcVar1;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  string pltfileTemp;
  string HeaderFileName;
  IO_Buffer io_buffer;
  StreamRetry sretry;
  ofstream HeaderFile;
  string local_4a8;
  undefined4 local_484;
  string local_480;
  double local_460;
  vector<char,_std::allocator<char>_> local_458;
  char *local_440;
  double local_438;
  undefined8 local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  undefined1 local_420 [24];
  undefined8 auStack_408 [46];
  StreamRetry local_298;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  local_438 = second();
  VisMF::SetNOutFiles((anonymous_namespace)::plot_nfiles,ParallelDescriptor::m_comm);
  local_484 = VisMF::currentVersion;
  VisMF::currentVersion = (anonymous_namespace)::plot_headerversion;
  StreamRetry::StreamRetry
            (&local_298,pltfile,this->abort_on_stream_retry_failure,this->stream_max_tries);
  bVar3 = AsyncOut::UseAsyncOut();
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  if (bVar3) {
    pcVar1 = (pltfile->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a8,pcVar1,pcVar1 + pltfile->_M_string_length);
  }
  else {
    pcVar1 = (pltfile->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a8,pcVar1,pcVar1 + pltfile->_M_string_length);
    std::__cxx11::string::append((char *)&local_4a8);
  }
  local_428 = _VTT;
  local_430 = __M_insert<void_const*>;
  local_440 = "Amr::writeSmallPlotFile() failed";
  if (regular) {
    local_440 = "Amr::writePlotFile() failed";
  }
  do {
    bVar3 = StreamRetry::TryFileOutput(&local_298);
    if (!bVar3) break;
    if ((anonymous_namespace)::precreateDirectories == '\x01') {
      UtilRenameDirectoryToOld(pltfile,false);
      UtilCreateCleanDirectory(&local_4a8,false);
      if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar4 = -1;
        do {
          _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar4 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var2.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10
                      ))(_Var2.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_4a8);
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      local_230 = (undefined1  [8])&local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"Amr::writePlotFile:PCD","");
      ParallelDescriptor::Barrier((string *)local_230);
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
    }
    else {
      UtilRenameDirectoryToOld(pltfile,false);
      UtilCreateCleanDirectory(&local_4a8,true);
    }
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_480,local_4a8._M_dataplus._M_p,
               local_4a8._M_dataplus._M_p + local_4a8._M_string_length);
    std::__cxx11::string::append((char *)&local_480);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_458,VisMFBuffer::ioBufferSize,(allocator_type *)local_230);
    std::ofstream::ofstream((string *)local_230);
    (**(code **)(local_228 + 0x18))
              (&local_228,
               local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      std::ofstream::open((char *)local_230,(_Ios_Openmode)local_480._M_dataplus._M_p);
      if (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0) {
        FileOpenFailed(&local_480);
      }
      lVar4 = (long)*(int *)((long)&local_228 + *(long *)((long)local_230 + -0x18));
      *(undefined8 *)((long)&local_228 + *(long *)((long)local_230 + -0x18)) = 0xf;
    }
    else {
      lVar4 = 0;
    }
    if (regular) {
      if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar5 = -1;
        do {
          _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar5 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var2.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x28
                      ))(_Var2.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_4a8,
                         (string *)local_230);
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar5 = -1;
        do {
          _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar5 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var2.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x20
                      ))(_Var2.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_4a8,
                         (string *)local_230,1);
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar5 = -1;
        do {
          _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar5 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          (**(code **)(*(long *)_Var2.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x30
                      ))(_Var2.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_4a8,
                         (string *)local_230);
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
    else if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
      lVar5 = -1;
      do {
        _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5 + 1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var2.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x38))
                  (_Var2.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&local_4a8,
                   (string *)local_230,1);
        lVar5 = lVar5 + 1;
      } while (lVar5 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    this_00 = (ostringstream *)(local_420 + 0x10);
    if ((*(int *)(ParallelContext::frames + 0xc) == 0) &&
       (*(long *)((long)&local_228 + *(long *)((long)local_230 + -0x18)) = lVar4,
       *(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0)) {
      Error_host(local_440);
    }
    if (regular) {
      this->last_plotfile =
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      this->last_smallplotfile =
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      local_460 = second();
      local_460 = local_460 - local_438;
      if (regular) {
        local_420._8_8_ = OutStream();
        local_420._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_420._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream(this_00);
        *(undefined8 *)((long)auStack_408 + *(long *)(local_420._16_8_ - 0x18)) =
             *(undefined8 *)(local_420._8_8_ + *(long *)(*(long *)local_420._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Write plotfile time = ",0x16);
        std::ostream::_M_insert<double>(local_460);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"  seconds",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n\n",2);
      }
      else {
        local_420._8_8_ = OutStream();
        this_01 = (ostringstream *)(local_420 + 0x10);
        local_420._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_420._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream(this_01);
        *(undefined8 *)((long)auStack_408 + *(long *)(local_420._16_8_ - 0x18)) =
             *(undefined8 *)(local_420._8_8_ + *(long *)(*(long *)local_420._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"Write small plotfile time = ",0x1c);
        std::ostream::_M_insert<double>(local_460);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"  seconds",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n\n",2);
      }
      Print::~Print((Print *)local_420);
    }
    bVar3 = AsyncOut::UseAsyncOut();
    if (!bVar3) {
      local_420._0_8_ = this_00;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,"Amr::writePlotFile::end","");
      ParallelDescriptor::Barrier((string *)local_420);
      if ((ostringstream *)local_420._0_8_ != this_00) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
      if (*(int *)(ParallelContext::frames + 0xc) == 0) {
        std::ofstream::close();
        rename(local_4a8._M_dataplus._M_p,(pltfile->_M_dataplus)._M_p);
      }
      local_420._0_8_ = this_00;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,"Renaming temporary plotfile.","");
      ParallelDescriptor::Barrier((string *)local_420);
      if ((ostringstream *)local_420._0_8_ != this_00) {
        operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
      }
    }
    local_230 = (undefined1  [8])local_428;
    *(undefined8 *)(local_230 + *(long *)(local_428->_M_local_buf + -0x18)) = local_430;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if (local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_458.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  } while (!bVar3);
  VisMF::currentVersion = local_484;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.suffix._M_dataplus._M_p != &local_298.suffix.field_2) {
    operator_delete(local_298.suffix._M_dataplus._M_p,
                    local_298.suffix.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.fileName._M_dataplus._M_p != &local_298.fileName.field_2) {
    operator_delete(local_298.fileName._M_dataplus._M_p,
                    local_298.fileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
Amr::writePlotFileDoit (std::string const& pltfile, bool regular)
{
    auto dPlotFileTime0 = amrex::second();

    VisMF::SetNOutFiles(plot_nfiles);
    VisMF::Header::Version currentVersion(VisMF::GetHeaderVersion());
    VisMF::SetHeaderVersion(plot_headerversion);

    amrex::StreamRetry sretry(pltfile, abort_on_stream_retry_failure,
                              stream_max_tries);

    const std::string pltfileTemp = (AsyncOut::UseAsyncOut()) ? pltfile : (pltfile + ".temp");

    while(sretry.TryFileOutput()) {
        //
        //  if either the pltfile or pltfileTemp exists, rename them
        //  to move them out of the way.  then create pltfile
        //  with the temporary name, then rename it back when
        //  it is finished writing.  then stream retry can rename
        //  it to a bad suffix if there were stream errors.
        //

        if (precreateDirectories) {    // ---- make all directories at once
            amrex::UtilRenameDirectoryToOld(pltfile, false);      // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, false);  // dont call barrier
            for(int i(0); i <= finest_level; ++i) {
                amr_level[i]->CreateLevelDirectory(pltfileTemp);
            }
            ParallelDescriptor::Barrier("Amr::writePlotFile:PCD");
        } else {
            amrex::UtilRenameDirectoryToOld(pltfile, false);     // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, true);  // call barrier
        }

        std::string HeaderFileName(pltfileTemp + "/Header");

        VisMF::IO_Buffer io_buffer(VisMF::GetIOBufferSize());

        std::ofstream HeaderFile;

        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());

        int old_prec(0);

        if (ParallelDescriptor::IOProcessor()) {
            //
            // Only the IOProcessor() writes to the header file.
            //
            HeaderFile.open(HeaderFileName.c_str(), std::ios::out | std::ios::trunc |
                            std::ios::binary);
            if ( ! HeaderFile.good()) {
                amrex::FileOpenFailed(HeaderFileName);
            }
            old_prec = HeaderFile.precision(15);
        }

        if (regular) {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePre(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFile(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePost(pltfileTemp, HeaderFile);
            }
        } else {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writeSmallPlotFile(pltfileTemp, HeaderFile);
            }
        }

        if (ParallelDescriptor::IOProcessor()) {
            HeaderFile.precision(old_prec);
            if ( ! HeaderFile.good()) {
                if (regular) {
                    amrex::Error("Amr::writePlotFile() failed");
                } else {
                    amrex::Error("Amr::writeSmallPlotFile() failed");
                }
            }
        }

        if (regular) {
            last_plotfile = level_steps[0];
        } else {
            last_smallplotfile = level_steps[0];
        }

        if (verbose > 0) {
            const int IOProc        = ParallelDescriptor::IOProcessorNumber();
            auto      dPlotFileTime = amrex::second() - dPlotFileTime0;
            ParallelDescriptor::ReduceRealMax(dPlotFileTime,IOProc);
            if (regular) {
                amrex::Print() << "Write plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            } else {
                amrex::Print() << "Write small plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            }
        }

        if (AsyncOut::UseAsyncOut()) {
            break;
        } else {
            ParallelDescriptor::Barrier("Amr::writePlotFile::end");
            if(ParallelDescriptor::IOProcessor()) {
                HeaderFile.close();
                std::rename(pltfileTemp.c_str(), pltfile.c_str());
            }
            ParallelDescriptor::Barrier("Renaming temporary plotfile.");
            //
            // the plotfile file now has the regular name
            //
        }
    }  // end while

    VisMF::SetHeaderVersion(currentVersion);
}